

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backtrace.cpp
# Opt level: O0

string * sh(string *cmd)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  runtime_error *this;
  FILE *pFVar4;
  pointer pvVar5;
  string *in_RDI;
  shared_ptr<_IO_FILE> pipe;
  array<char,_128UL> buffer;
  string *result;
  _IO_FILE *in_stack_ffffffffffffff08;
  shared_ptr<_IO_FILE> *in_stack_ffffffffffffff10;
  __shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> local_a8;
  byte local_91;
  
  local_91 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  popen(pcVar3,"r");
  std::shared_ptr<_IO_FILE>::shared_ptr<_IO_FILE,int(*)(_IO_FILE*),void>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(_func_int__IO_FILE_ptr *)0x1a6099)
  ;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_a8);
  if (bVar1) {
    while( true ) {
      pFVar4 = (FILE *)std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::get(&local_a8);
      iVar2 = feof(pFVar4);
      if (iVar2 != 0) break;
      pvVar5 = std::array<char,_128UL>::data((array<char,_128UL> *)0x1a615c);
      pFVar4 = (FILE *)std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::get(&local_a8);
      pcVar3 = fgets(pvVar5,0x80,pFVar4);
      if (pcVar3 != (char *)0x0) {
        pvVar5 = std::array<char,_128UL>::data((array<char,_128UL> *)0x1a6199);
        std::__cxx11::string::operator+=((string *)in_RDI,pvVar5);
      }
    }
    local_91 = 1;
    std::shared_ptr<_IO_FILE>::~shared_ptr((shared_ptr<_IO_FILE> *)0x1a61bb);
    if ((local_91 & 1) == 0) {
      std::__cxx11::string::~string((string *)in_RDI);
    }
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"popen() failed!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

string sh(string cmd) {
    array<char, 128> buffer;
    string result;
    shared_ptr<FILE> pipe(popen(cmd.c_str(), "r"), pclose);
    if (!pipe) throw runtime_error("popen() failed!");
    while (!feof(pipe.get())) {
        if (fgets(buffer.data(), 128, pipe.get()) != nullptr) {
            result += buffer.data();
        }
    }
    return result;
}